

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapstyle.cpp
# Opt level: O2

void __thiscall
QPixmapStyle::drawProgressBarLabel
          (QPixmapStyle *this,QStyleOption *option,QPainter *painter,QWidget *param_3)

{
  QStyleOptionProgressBar *this_00;
  QStyle *pQVar1;
  
  this_00 = qstyleoption_cast<QStyleOptionProgressBar_const*>(option);
  if ((this_00 != (QStyleOptionProgressBar *)0x0) &&
     (((this_00->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
       super_QFlagsStorage<QStyle::StateFlag>.i & 0x80) != 0)) {
    pQVar1 = QStyle::proxy((QStyle *)this_00);
    (**(code **)(*(long *)pQVar1 + 0x98))
              (pQVar1,painter,&(this_00->super_QStyleOption).rect,0x184,
               &(this_00->super_QStyleOption).palette,
               (this_00->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
               super_QFlagsStorage<QStyle::StateFlag>.i & 1,&this_00->text,8);
  }
  return;
}

Assistant:

void QPixmapStyle::drawProgressBarLabel(const QStyleOption *option,
                                        QPainter *painter, const QWidget *) const
{
    if (const QStyleOptionProgressBar *pb =
                    qstyleoption_cast<const QStyleOptionProgressBar *>(option)) {
        const bool vertical = !(pb->state & QStyle::State_Horizontal);
        if (!vertical) {
            QPalette::ColorRole textRole = QPalette::ButtonText;
            proxy()->drawItemText(painter, pb->rect,
                                  Qt::AlignCenter | Qt::TextSingleLine, pb->palette,
                                  pb->state & State_Enabled, pb->text, textRole);
        }
    }
}